

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBase.cpp
# Opt level: O0

void Diligent::ValidateBufferInitData(BufferDesc *Desc,BufferData *pBuffData)

{
  CPU_ACCESS_FLAGS CVar1;
  int iVar2;
  undefined4 extraout_var;
  char *local_f0;
  char *local_d8;
  char *local_d0;
  DeviceContextDesc *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  bool local_99;
  char *local_98;
  unsigned_long local_90;
  char *local_88;
  char *local_80;
  char **local_78;
  DeviceContextDesc *CtxDesc;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  bool local_41;
  BufferData *pBStack_40;
  bool HasInitialData;
  BufferData *pBuffData_local;
  BufferDesc *Desc_local;
  
  local_99 = false;
  if (pBuffData != (BufferData *)0x0) {
    local_99 = pBuffData->pData != (void *)0x0;
  }
  local_41 = local_99;
  pBStack_40 = pBuffData;
  pBuffData_local = (BufferData *)Desc;
  if ((Desc->Usage == USAGE_IMMUTABLE) && (local_99 == false)) {
    if ((Desc->super_DeviceObjectAttribs).Name == (Char *)0x0) {
      local_a8 = "";
    }
    else {
      local_a8 = (Desc->super_DeviceObjectAttribs).Name;
    }
    local_50 = local_a8;
    LogError<true,char[24],char_const*,char[15],char[89]>
              (false,"ValidateBufferInitData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
               ,0xae,(char (*) [24])"Description of buffer \'",&local_50,
               (char (*) [15])"\' is invalid: ",
               (char (*) [89])
               "initial data must not be null as immutable buffers must be initialized at creation time."
              );
  }
  if ((*(char *)((long)&pBuffData_local->pContext + 4) == '\x02') && ((local_41 & 1U) != 0)) {
    if (pBuffData_local->pData == (void *)0x0) {
      local_b0 = "";
    }
    else {
      local_b0 = (char *)pBuffData_local->pData;
    }
    local_58 = local_b0;
    LogError<true,char[24],char_const*,char[15],char[47]>
              (false,"ValidateBufferInitData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
               ,0xb1,(char (*) [24])"Description of buffer \'",&local_58,
               (char (*) [15])"\' is invalid: ",
               (char (*) [47])"initial data must be null for dynamic buffers.");
  }
  if ((*(char *)((long)&pBuffData_local->pContext + 4) == '\x05') && ((local_41 & 1U) != 0)) {
    if (pBuffData_local->pData == (void *)0x0) {
      local_b8 = "";
    }
    else {
      local_b8 = (char *)pBuffData_local->pData;
    }
    local_60 = local_b8;
    LogError<true,char[24],char_const*,char[15],char[46]>
              (false,"ValidateBufferInitData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
               ,0xb4,(char (*) [24])"Description of buffer \'",&local_60,
               (char (*) [15])"\' is invalid: ",
               (char (*) [46])"initial data must be null for sparse buffers.");
  }
  if (*(char *)((long)&pBuffData_local->pContext + 4) == '\x03') {
    if ((*(char *)((long)&pBuffData_local->pContext + 5) == '\x02') && ((local_41 & 1U) != 0)) {
      if (pBuffData_local->pData == (void *)0x0) {
        local_c0 = "";
      }
      else {
        local_c0 = (char *)pBuffData_local->pData;
      }
      local_68 = local_c0;
      LogError<true,char[24],char_const*,char[15],char[54]>
                (false,"ValidateBufferInitData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0xba,(char (*) [24])"Description of buffer \'",&local_68,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [54])"CPU-writable staging buffers must be updated via map.");
    }
  }
  else if (((*(char *)((long)&pBuffData_local->pContext + 4) == '\x04') && ((local_41 & 1U) != 0))
          && (CVar1 = operator&(*(CPU_ACCESS_FLAGS *)((long)&pBuffData_local->pContext + 5),
                                CPU_ACCESS_FLAG_LAST), CVar1 == CPU_ACCESS_NONE)) {
    if (pBuffData_local->pData == (void *)0x0) {
      local_c8 = (DeviceContextDesc *)0xc361e0;
    }
    else {
      local_c8 = (DeviceContextDesc *)pBuffData_local->pData;
    }
    CtxDesc = local_c8;
    LogError<true,char[24],char_const*,char[15],char[66]>
              (false,"ValidateBufferInitData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
               ,0xc1,(char (*) [24])"Description of buffer \'",(char **)&CtxDesc,
               (char (*) [15])"\' is invalid: ",
               (char (*) [66])"CPU_ACCESS_WRITE flag is required to initialize a unified buffer.");
  }
  if ((pBStack_40 != (BufferData *)0x0) && (pBStack_40->pContext != (IDeviceContext *)0x0)) {
    iVar2 = (*(pBStack_40->pContext->super_IObject)._vptr_IObject[4])();
    local_78 = (char **)CONCAT44(extraout_var,iVar2);
    if ((*(byte *)((long)local_78 + 9) & 1) != 0) {
      if (pBuffData_local->pData == (void *)0x0) {
        local_d0 = "";
      }
      else {
        local_d0 = (char *)pBuffData_local->pData;
      }
      local_80 = local_d0;
      LogError<true,char[24],char_const*,char[15],char[56]>
                (false,"ValidateBufferInitData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0xc9,(char (*) [24])"Description of buffer \'",&local_80,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [56])"Deferred contexts can\'t be used to initialize resources");
    }
    if ((pBuffData_local[1].DataSize & 1L << (*(byte *)((long)local_78 + 10) & 0x3f)) == 0) {
      if (pBuffData_local->pData == (void *)0x0) {
        local_d8 = "";
      }
      else {
        local_d8 = (char *)pBuffData_local->pData;
      }
      local_88 = local_d8;
      local_90 = 1L << (*(byte *)((long)local_78 + 10) & 0x3f);
      LogError<true,char[24],char_const*,char[15],char[50],char_const*,char[28],std::ios_base&(std::ios_base&),unsigned_long,char[20],std::ios_base&(std::ios_base&),unsigned_long,char[6]>
                (false,"ValidateBufferInitData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0xce,(char (*) [24])"Description of buffer \'",&local_88,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [50])"Can not initialize the buffer in device context \'",local_78,
                 (char (*) [28])"\' as ImmediateContextMask (",std::hex,&pBuffData_local[1].DataSize
                 ,(char (*) [20])") does not contain ",std::hex,&local_90,(char (*) [6])" bit.");
    }
  }
  if (((local_41 & 1U) != 0) && (pBStack_40->DataSize < pBuffData_local->DataSize)) {
    if (pBuffData_local->pData == (void *)0x0) {
      local_f0 = "";
    }
    else {
      local_f0 = (char *)pBuffData_local->pData;
    }
    local_98 = local_f0;
    LogError<true,char[24],char_const*,char[15],char[26],unsigned_long,char[40],unsigned_long,char[2]>
              (false,"ValidateBufferInitData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
               ,0xd5,(char (*) [24])"Description of buffer \'",&local_98,
               (char (*) [15])"\' is invalid: ",(char (*) [26])"Buffer initial DataSize (",
               &pBStack_40->DataSize,(char (*) [40])") must be larger than the buffer size (",
               &pBuffData_local->DataSize,(char (*) [2])0xcabce5);
  }
  return;
}

Assistant:

void ValidateBufferInitData(const BufferDesc& Desc, const BufferData* pBuffData) noexcept(false)
{
    const bool HasInitialData = (pBuffData != nullptr && pBuffData->pData != nullptr);

    if (Desc.Usage == USAGE_IMMUTABLE && !HasInitialData)
        LOG_BUFFER_ERROR_AND_THROW("initial data must not be null as immutable buffers must be initialized at creation time.");

    if (Desc.Usage == USAGE_DYNAMIC && HasInitialData)
        LOG_BUFFER_ERROR_AND_THROW("initial data must be null for dynamic buffers.");

    if (Desc.Usage == USAGE_SPARSE && HasInitialData)
        LOG_BUFFER_ERROR_AND_THROW("initial data must be null for sparse buffers.");

    if (Desc.Usage == USAGE_STAGING)
    {
        if (Desc.CPUAccessFlags == CPU_ACCESS_WRITE)
        {
            VERIFY_BUFFER(!HasInitialData, "CPU-writable staging buffers must be updated via map.");
        }
    }
    else if (Desc.Usage == USAGE_UNIFIED)
    {
        if (HasInitialData && (Desc.CPUAccessFlags & CPU_ACCESS_WRITE) == 0)
        {
            LOG_BUFFER_ERROR_AND_THROW("CPU_ACCESS_WRITE flag is required to initialize a unified buffer.");
        }
    }

    if (pBuffData != nullptr && pBuffData->pContext != nullptr)
    {
        const DeviceContextDesc& CtxDesc = pBuffData->pContext->GetDesc();
        if (CtxDesc.IsDeferred)
            LOG_BUFFER_ERROR_AND_THROW("Deferred contexts can't be used to initialize resources");
        if ((Desc.ImmediateContextMask & (Uint64{1} << CtxDesc.ContextId)) == 0)
        {
            LOG_BUFFER_ERROR_AND_THROW("Can not initialize the buffer in device context '", CtxDesc.Name,
                                       "' as ImmediateContextMask (", std::hex, Desc.ImmediateContextMask, ") does not contain ",
                                       std::hex, (Uint64{1} << CtxDesc.ContextId), " bit.");
        }
    }

    if (HasInitialData)
    {
        VERIFY_BUFFER(pBuffData->DataSize >= Desc.Size,
                      "Buffer initial DataSize (", pBuffData->DataSize, ") must be larger than the buffer size (", Desc.Size, ")");
    }
}